

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  NodeRef root;
  RayK<8> *pRVar8;
  float fVar9;
  undefined1 auVar10 [16];
  size_t k;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [24];
  undefined1 auVar35 [24];
  undefined1 auVar36 [24];
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  size_t *psVar43;
  RayK<8> *pRVar44;
  long lVar45;
  undefined1 (*pauVar46) [32];
  undefined4 uVar47;
  RayK<8> *unaff_R15;
  bool bVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  uint uVar79;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined4 uVar89;
  undefined1 auVar83 [64];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  Precalculations pre;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d29;
  RayK<8> *local_5d28;
  BVH *local_5d20;
  Intersectors *local_5d18;
  RayK<8> *local_5d10;
  RayQueryContext *local_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [32];
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined8 local_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined8 local_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 local_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5d20 = (BVH *)This->ptr;
  if ((local_5d20->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar62 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar54 = ZEXT816(0) << 0x40;
      auVar53 = vpcmpeqd_avx2(auVar62,(undefined1  [32])valid_i->field_0);
      auVar62 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar54),5);
      auVar55 = auVar53 & auVar62;
      if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar55 >> 0x7f,0) != '\0') ||
            (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar55 >> 0xbf,0) != '\0') ||
          (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar55[0x1f] < '\0') {
        auVar62 = vandps_avx(auVar62,auVar53);
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        local_5c00._8_4_ = 0x7fffffff;
        local_5c00._0_8_ = 0x7fffffff7fffffff;
        local_5c00._12_4_ = 0x7fffffff;
        local_5c00._16_4_ = 0x7fffffff;
        local_5c00._20_4_ = 0x7fffffff;
        local_5c00._24_4_ = 0x7fffffff;
        local_5c00._28_4_ = 0x7fffffff;
        auVar90._8_4_ = 0x219392ef;
        auVar90._0_8_ = 0x219392ef219392ef;
        auVar90._12_4_ = 0x219392ef;
        auVar90._16_4_ = 0x219392ef;
        auVar90._20_4_ = 0x219392ef;
        auVar90._24_4_ = 0x219392ef;
        auVar90._28_4_ = 0x219392ef;
        auVar55 = vandps_avx(local_5c00,local_59e0);
        auVar55 = vcmpps_avx(auVar55,auVar90,1);
        auVar53 = vblendvps_avx(local_59e0,auVar90,auVar55);
        auVar55 = vandps_avx(local_5c00,local_59c0);
        auVar55 = vcmpps_avx(auVar55,auVar90,1);
        auVar65 = vblendvps_avx(local_59c0,auVar90,auVar55);
        auVar55 = vandps_avx(local_59a0,local_5c00);
        auVar55 = vcmpps_avx(auVar55,auVar90,1);
        auVar55 = vblendvps_avx(local_59a0,auVar90,auVar55);
        auVar10 = vpackssdw_avx(auVar62._0_16_,auVar62._16_16_);
        auVar62 = vrcpps_avx(auVar53);
        auVar80._8_4_ = 0x3f800000;
        auVar80._0_8_ = &DAT_3f8000003f800000;
        auVar80._12_4_ = 0x3f800000;
        auVar80._16_4_ = 0x3f800000;
        auVar80._20_4_ = 0x3f800000;
        auVar80._24_4_ = 0x3f800000;
        auVar80._28_4_ = 0x3f800000;
        auVar14 = vfnmadd213ps_fma(auVar53,auVar62,auVar80);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar62,auVar62);
        auVar62 = vrcpps_avx(auVar65);
        auVar15 = vfnmadd213ps_fma(auVar65,auVar62,auVar80);
        auVar53 = vrcpps_avx(auVar55);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar62,auVar62);
        auVar16 = vfnmadd213ps_fma(auVar55,auVar53,auVar80);
        auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar53,auVar53);
        local_5980 = ZEXT1632(auVar14);
        local_5960 = ZEXT1632(auVar15);
        local_5940 = ZEXT1632(auVar16);
        local_5920 = auVar14._0_4_ * (float)local_5a40._0_4_;
        fStack_591c = auVar14._4_4_ * (float)local_5a40._4_4_;
        fStack_5918 = auVar14._8_4_ * (float)local_5a40._8_4_;
        fStack_5914 = auVar14._12_4_ * (float)local_5a40._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar15._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar15._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar15._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar15._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0 = (float)local_5a40._64_4_ * auVar16._0_4_;
        fStack_58dc = (float)local_5a40._68_4_ * auVar16._4_4_;
        fStack_58d8 = (float)local_5a40._72_4_ * auVar16._8_4_;
        fStack_58d4 = (float)local_5a40._76_4_ * auVar16._12_4_;
        fStack_58d0 = (float)local_5a40._80_4_ * 0.0;
        fStack_58cc = (float)local_5a40._84_4_ * 0.0;
        fStack_58c8 = (float)local_5a40._88_4_ * 0.0;
        auVar62 = vcmpps_avx(local_5980,ZEXT1632(auVar54),1);
        auVar65._8_4_ = 0x20;
        auVar65._0_8_ = 0x2000000020;
        auVar65._12_4_ = 0x20;
        auVar65._16_4_ = 0x20;
        auVar65._20_4_ = 0x20;
        auVar65._24_4_ = 0x20;
        auVar65._28_4_ = 0x20;
        local_58c0 = vandps_avx(auVar62,auVar65);
        auVar55 = ZEXT1632(auVar54);
        auVar62 = vcmpps_avx(ZEXT1632(auVar15),auVar55,5);
        auVar66._8_4_ = 0x40;
        auVar66._0_8_ = 0x4000000040;
        auVar66._12_4_ = 0x40;
        auVar66._16_4_ = 0x40;
        auVar66._20_4_ = 0x40;
        auVar66._24_4_ = 0x40;
        auVar66._28_4_ = 0x40;
        auVar72._8_4_ = 0x60;
        auVar72._0_8_ = 0x6000000060;
        auVar72._12_4_ = 0x60;
        auVar72._16_4_ = 0x60;
        auVar72._20_4_ = 0x60;
        auVar72._24_4_ = 0x60;
        auVar72._28_4_ = 0x60;
        local_58a0 = vblendvps_avx(auVar72,auVar66,auVar62);
        auVar62 = vcmpps_avx(ZEXT1632(auVar16),auVar55,5);
        auVar67._8_4_ = 0x80;
        auVar67._0_8_ = 0x8000000080;
        auVar67._12_4_ = 0x80;
        auVar67._16_4_ = 0x80;
        auVar67._20_4_ = 0x80;
        auVar67._24_4_ = 0x80;
        auVar67._28_4_ = 0x80;
        auVar73._8_4_ = 0xa0;
        auVar73._0_8_ = 0xa0000000a0;
        auVar73._12_4_ = 0xa0;
        auVar73._16_4_ = 0xa0;
        auVar73._20_4_ = 0xa0;
        auVar73._24_4_ = 0xa0;
        auVar73._28_4_ = 0xa0;
        local_5880 = vblendvps_avx(auVar73,auVar67,auVar62);
        auVar62 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar55);
        local_5be0 = vpmovsxwd_avx2(auVar10);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar83 = ZEXT3264(local_4680);
        local_5860 = vblendvps_avx(local_4680,auVar62,local_5be0);
        auVar62 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar55);
        auVar55._8_4_ = 0xff800000;
        auVar55._0_8_ = 0xff800000ff800000;
        auVar55._12_4_ = 0xff800000;
        auVar55._16_4_ = 0xff800000;
        auVar55._20_4_ = 0xff800000;
        auVar55._24_4_ = 0xff800000;
        auVar55._28_4_ = 0xff800000;
        local_5840 = vblendvps_avx(auVar55,auVar62,local_5be0);
        auVar54 = vpcmpeqd_avx(local_5840._0_16_,local_5840._0_16_);
        local_5cc0 = vpmovsxwd_avx2(auVar10 ^ auVar54);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar41 = 7;
        }
        else {
          uVar41 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5d28 = ray + 0x100;
        psVar43 = local_5808 + 1;
        local_5810 = 0xfffffffffffffff8;
        pauVar46 = (undefined1 (*) [32])local_4640;
        local_5808[0] = (local_5d20->root).ptr;
        local_4660 = local_5860;
        local_5d00 = mm_lookupmask_ps._16_8_;
        uStack_5cf8 = mm_lookupmask_ps._24_8_;
        uStack_5cf0 = mm_lookupmask_ps._16_8_;
        uStack_5ce8 = mm_lookupmask_ps._24_8_;
        auVar62 = vpcmpeqd_avx2(auVar53,auVar53);
        auVar92 = ZEXT3264(auVar62);
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
        uStack_58c4 = local_5a40._92_4_;
LAB_00686a15:
        pauVar46 = pauVar46 + -1;
        root.ptr = psVar43[-1];
        psVar43 = psVar43 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_0068703f;
        local_5c80 = *pauVar46;
        auVar62 = vcmpps_avx(local_5c80,local_5840,1);
        if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar62 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar62 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar62 >> 0x7f,0) == '\0') &&
              (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar62 >> 0xbf,0) == '\0') &&
            (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar62[0x1f]) {
LAB_00687050:
          iVar37 = 2;
        }
        else {
          uVar47 = vmovmskps_avx(auVar62);
          unaff_R15 = (RayK<8> *)CONCAT44((int)((ulong)unaff_R15 >> 0x20),uVar47);
          iVar37 = 0;
          if ((uint)POPCOUNT(uVar47) <= uVar41) {
            local_5ca0._0_8_ = uVar41;
            while (unaff_R15 != (RayK<8> *)0x0) {
              k = 0;
              for (pRVar44 = unaff_R15; ((ulong)pRVar44 & 1) == 0;
                  pRVar44 = (RayK<8> *)((ulong)pRVar44 >> 1 | 0x8000000000000000)) {
                k = k + 1;
              }
              local_5ce0._0_8_ = k;
              auVar62 = ZEXT1632(auVar92._0_16_);
              local_5d18 = This;
              local_5d10 = ray;
              local_5d08 = context;
              bVar48 = occluded1(This,local_5d20,root,k,&local_5d29,ray,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,context);
              if (bVar48) {
                *(undefined4 *)(local_5cc0 + local_5ce0._0_8_ * 4) = 0xffffffff;
              }
              unaff_R15 = (RayK<8> *)((ulong)(unaff_R15 + -1) & (ulong)unaff_R15);
              auVar83 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar62 = vpcmpeqd_avx2(auVar62,auVar62);
              auVar92 = ZEXT3264(auVar62);
              This = local_5d18;
              ray = local_5d10;
              context = local_5d08;
            }
            auVar62 = auVar92._0_32_ & ~local_5cc0;
            iVar37 = 3;
            unaff_R15 = (RayK<8> *)0x0;
            uVar41 = local_5ca0._0_8_;
            if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar62 >> 0x7f,0) != '\0') ||
                  (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar62 >> 0xbf,0) != '\0') ||
                (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar62[0x1f] < '\0') {
              auVar62._8_4_ = 0xff800000;
              auVar62._0_8_ = 0xff800000ff800000;
              auVar62._12_4_ = 0xff800000;
              auVar62._16_4_ = 0xff800000;
              auVar62._20_4_ = 0xff800000;
              auVar62._24_4_ = 0xff800000;
              auVar62._28_4_ = 0xff800000;
              local_5840 = vblendvps_avx(local_5840,auVar62,local_5cc0);
              iVar37 = 2;
            }
          }
          if ((uint)uVar41 < (uint)POPCOUNT(uVar47)) {
            unaff_R15 = (RayK<8> *)0x8;
            do {
              if ((root.ptr & 8) != 0) {
                if ((RayK<8> *)root.ptr == (RayK<8> *)&DAT_fffffffffffffff8) goto LAB_0068703f;
                local_5c20 = local_5840;
                auVar62 = vcmpps_avx(local_5840,local_5c80,6);
                if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar62 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar62 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar62 >> 0x7f,0) == '\0') &&
                      (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar62 >> 0xbf,0) == '\0') &&
                    (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar62[0x1f]) goto LAB_00687050;
                uVar38 = (ulong)((uint)root.ptr & 0xf);
                auVar53 = local_5cc0;
                if (uVar38 == 8) goto LAB_00687006;
                auVar60._0_4_ = auVar92._0_4_ ^ local_5cc0._0_4_;
                auVar60._4_4_ = auVar92._4_4_ ^ local_5cc0._4_4_;
                auVar60._8_4_ = auVar92._8_4_ ^ local_5cc0._8_4_;
                auVar60._12_4_ = auVar92._12_4_ ^ local_5cc0._12_4_;
                auVar60._16_4_ = auVar92._16_4_ ^ local_5cc0._16_4_;
                auVar60._20_4_ = auVar92._20_4_ ^ local_5cc0._20_4_;
                auVar60._24_4_ = auVar92._24_4_ ^ local_5cc0._24_4_;
                auVar60._28_4_ = auVar92._28_4_ ^ local_5cc0._28_4_;
                local_5a60 = *(undefined8 *)ray;
                uStack_5a58 = *(undefined8 *)(ray + 8);
                uStack_5a50 = *(undefined8 *)(ray + 0x10);
                uStack_5a48 = *(undefined8 *)(ray + 0x18);
                local_5a80 = *(undefined8 *)(ray + 0x20);
                uStack_5a78 = *(undefined8 *)(ray + 0x28);
                uStack_5a70 = *(undefined8 *)(ray + 0x30);
                uStack_5a68 = *(undefined8 *)(ray + 0x38);
                local_5aa0 = *(undefined8 *)(ray + 0x40);
                uStack_5a98 = *(undefined8 *)(ray + 0x48);
                uStack_5a90 = *(undefined8 *)(ray + 0x50);
                uStack_5a88 = *(undefined8 *)(ray + 0x58);
                uVar25 = *(undefined8 *)(ray + 0x60);
                uVar26 = *(undefined8 *)(ray + 0x68);
                uVar27 = *(undefined8 *)(ray + 0x70);
                uStack_5c28 = *(undefined8 *)(ray + 0x78);
                pRVar44 = ray + 0xa0;
                local_5ac0 = *(undefined8 *)pRVar44;
                uStack_5ab8 = *(undefined8 *)(ray + 0xa8);
                uStack_5ab0 = *(undefined8 *)(ray + 0xb0);
                auVar34 = *(undefined1 (*) [24])pRVar44;
                uStack_5aa8 = *(undefined8 *)(ray + 0xb8);
                pRVar8 = ray + 0xc0;
                local_5ae0 = *(undefined8 *)pRVar8;
                uStack_5ad8 = *(undefined8 *)(ray + 200);
                uStack_5ad0 = *(undefined8 *)(ray + 0xd0);
                auVar35 = *(undefined1 (*) [24])pRVar8;
                uStack_5ac8 = *(undefined8 *)(ray + 0xd8);
                pRVar1 = ray + 0x80;
                local_5b00 = *(undefined8 *)pRVar1;
                uStack_5af8 = *(undefined8 *)(ray + 0x88);
                uStack_5af0 = *(undefined8 *)(ray + 0x90);
                auVar36 = *(undefined1 (*) [24])pRVar1;
                uStack_5ae8 = *(undefined8 *)(ray + 0x98);
                uVar28 = *(undefined8 *)(ray + 0x100);
                uVar29 = *(undefined8 *)(ray + 0x108);
                uVar30 = *(undefined8 *)(ray + 0x110);
                uStack_5c48 = *(undefined8 *)(ray + 0x118);
                local_5b20 = *(undefined8 *)(ray + 0x120);
                uStack_5b18 = *(undefined8 *)(ray + 0x128);
                uStack_5b10 = *(undefined8 *)(ray + 0x130);
                uStack_5b08 = *(undefined8 *)(ray + 0x138);
                lVar45 = (root.ptr & 0xfffffffffffffff0) + 0x90;
                uVar39 = 0;
                local_5ca0 = local_5cc0;
                goto LAB_00686cfc;
              }
              auVar95 = ZEXT3264(auVar83._0_32_);
              uVar38 = 0;
              pRVar44 = unaff_R15;
              do {
                pRVar8 = *(RayK<8> **)((root.ptr & 0xfffffffffffffff0) + uVar38 * 8);
                if (pRVar8 != (RayK<8> *)0x8) {
                  uVar47 = *(undefined4 *)(root.ptr + uVar38 * 4 + 0x40);
                  auVar56._4_4_ = uVar47;
                  auVar56._0_4_ = uVar47;
                  auVar56._8_4_ = uVar47;
                  auVar56._12_4_ = uVar47;
                  auVar56._16_4_ = uVar47;
                  auVar56._20_4_ = uVar47;
                  auVar56._24_4_ = uVar47;
                  auVar56._28_4_ = uVar47;
                  auVar31._4_4_ = fStack_591c;
                  auVar31._0_4_ = local_5920;
                  auVar31._8_4_ = fStack_5918;
                  auVar31._12_4_ = fStack_5914;
                  auVar31._16_4_ = fStack_5910;
                  auVar31._20_4_ = fStack_590c;
                  auVar31._24_4_ = fStack_5908;
                  auVar31._28_4_ = uStack_5904;
                  uVar47 = *(undefined4 *)(root.ptr + uVar38 * 4 + 0x80);
                  auVar74._4_4_ = uVar47;
                  auVar74._0_4_ = uVar47;
                  auVar74._8_4_ = uVar47;
                  auVar74._12_4_ = uVar47;
                  auVar74._16_4_ = uVar47;
                  auVar74._20_4_ = uVar47;
                  auVar74._24_4_ = uVar47;
                  auVar74._28_4_ = uVar47;
                  auVar54 = vfmsub213ps_fma(auVar56,local_5980,auVar31);
                  auVar32._4_4_ = fStack_58fc;
                  auVar32._0_4_ = local_5900;
                  auVar32._8_4_ = fStack_58f8;
                  auVar32._12_4_ = fStack_58f4;
                  auVar32._16_4_ = fStack_58f0;
                  auVar32._20_4_ = fStack_58ec;
                  auVar32._24_4_ = fStack_58e8;
                  auVar32._28_4_ = uStack_58e4;
                  uVar47 = *(undefined4 *)(root.ptr + uVar38 * 4 + 0xc0);
                  auVar76._4_4_ = uVar47;
                  auVar76._0_4_ = uVar47;
                  auVar76._8_4_ = uVar47;
                  auVar76._12_4_ = uVar47;
                  auVar76._16_4_ = uVar47;
                  auVar76._20_4_ = uVar47;
                  auVar76._24_4_ = uVar47;
                  auVar76._28_4_ = uVar47;
                  auVar10 = vfmsub213ps_fma(auVar74,local_5960,auVar32);
                  auVar33._4_4_ = fStack_58dc;
                  auVar33._0_4_ = local_58e0;
                  auVar33._8_4_ = fStack_58d8;
                  auVar33._12_4_ = fStack_58d4;
                  auVar33._16_4_ = fStack_58d0;
                  auVar33._20_4_ = fStack_58cc;
                  auVar33._24_4_ = fStack_58c8;
                  auVar33._28_4_ = uStack_58c4;
                  uVar47 = *(undefined4 *)(root.ptr + uVar38 * 4 + 0x60);
                  auVar77._4_4_ = uVar47;
                  auVar77._0_4_ = uVar47;
                  auVar77._8_4_ = uVar47;
                  auVar77._12_4_ = uVar47;
                  auVar77._16_4_ = uVar47;
                  auVar77._20_4_ = uVar47;
                  auVar77._24_4_ = uVar47;
                  auVar77._28_4_ = uVar47;
                  auVar14 = vfmsub213ps_fma(auVar76,local_5940,auVar33);
                  auVar15 = vfmsub213ps_fma(auVar77,local_5980,auVar31);
                  uVar47 = *(undefined4 *)(root.ptr + uVar38 * 4 + 0xa0);
                  auVar68._4_4_ = uVar47;
                  auVar68._0_4_ = uVar47;
                  auVar68._8_4_ = uVar47;
                  auVar68._12_4_ = uVar47;
                  auVar68._16_4_ = uVar47;
                  auVar68._20_4_ = uVar47;
                  auVar68._24_4_ = uVar47;
                  auVar68._28_4_ = uVar47;
                  auVar16 = vfmsub213ps_fma(auVar68,local_5960,auVar32);
                  uVar47 = *(undefined4 *)(root.ptr + uVar38 * 4 + 0xe0);
                  auVar59._4_4_ = uVar47;
                  auVar59._0_4_ = uVar47;
                  auVar59._8_4_ = uVar47;
                  auVar59._12_4_ = uVar47;
                  auVar59._16_4_ = uVar47;
                  auVar59._20_4_ = uVar47;
                  auVar59._24_4_ = uVar47;
                  auVar59._28_4_ = uVar47;
                  auVar11 = vfmsub213ps_fma(auVar59,local_5940,auVar33);
                  auVar62 = vpminsd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar15));
                  auVar55 = vpminsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar16));
                  auVar62 = vpmaxsd_avx2(auVar62,auVar55);
                  auVar55 = vpminsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar11));
                  auVar55 = vpmaxsd_avx2(auVar62,auVar55);
                  auVar62 = vpmaxsd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar15));
                  auVar53 = vpmaxsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar16));
                  auVar53 = vpminsd_avx2(auVar62,auVar53);
                  auVar62 = vpmaxsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar11));
                  auVar53 = vpminsd_avx2(auVar53,auVar62);
                  auVar62 = vpmaxsd_avx2(auVar55,local_5860);
                  auVar53 = vpminsd_avx2(auVar53,local_5840);
                  auVar62 = vcmpps_avx(auVar62,auVar53,2);
                  if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar62 >> 0x7f,0) != '\0') ||
                        (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar62 >> 0xbf,0) != '\0') ||
                      (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar62[0x1f] < '\0') {
                    auVar62 = vblendvps_avx(auVar83._0_32_,auVar55,auVar62);
                    if (pRVar44 != (RayK<8> *)0x8) {
                      *psVar43 = (size_t)pRVar44;
                      psVar43 = psVar43 + 1;
                      *pauVar46 = auVar95._0_32_;
                      pauVar46 = pauVar46 + 1;
                    }
                    auVar95 = ZEXT3264(auVar62);
                    pRVar44 = pRVar8;
                  }
                }
                local_5c80 = auVar95._0_32_;
              } while ((pRVar8 != (RayK<8> *)0x8) &&
                      (bVar48 = uVar38 < 7, uVar38 = uVar38 + 1, bVar48));
              iVar37 = 0;
              if (pRVar44 == (RayK<8> *)0x8) {
LAB_00686bf9:
                bVar48 = false;
                iVar37 = 4;
              }
              else {
                auVar62 = vcmpps_avx(local_5840,local_5c80,6);
                uVar47 = vmovmskps_avx(auVar62);
                bVar48 = true;
                if ((uint)POPCOUNT(uVar47) <= (uint)uVar41) {
                  *psVar43 = (size_t)pRVar44;
                  psVar43 = psVar43 + 1;
                  *pauVar46 = local_5c80;
                  pauVar46 = pauVar46 + 1;
                  goto LAB_00686bf9;
                }
              }
              root.ptr = (size_t)pRVar44;
            } while (bVar48);
          }
        }
        goto LAB_00687042;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar39 = uVar39 + 1;
    lVar45 = lVar45 + 0xb0;
    auVar60 = auVar55;
    if (uVar38 - 8 <= uVar39) break;
LAB_00686cfc:
    uVar40 = 0;
    auVar62 = auVar60;
    while (auVar55 = auVar62, uVar42 = (ulong)*(uint *)(lVar45 + uVar40 * 4), auVar62 = auVar55,
          uVar42 != 0xffffffff) {
      uVar47 = *(undefined4 *)(lVar45 + -0x90 + uVar40 * 4);
      auVar49._4_4_ = uVar47;
      auVar49._0_4_ = uVar47;
      auVar49._8_4_ = uVar47;
      auVar49._12_4_ = uVar47;
      auVar49._16_4_ = uVar47;
      auVar49._20_4_ = uVar47;
      auVar49._24_4_ = uVar47;
      auVar49._28_4_ = uVar47;
      local_5b80 = vsubps_avx(auVar49,*(undefined1 (*) [32])ray);
      uVar47 = *(undefined4 *)(lVar45 + -0x80 + uVar40 * 4);
      auVar50._4_4_ = uVar47;
      auVar50._0_4_ = uVar47;
      auVar50._8_4_ = uVar47;
      auVar50._12_4_ = uVar47;
      auVar50._16_4_ = uVar47;
      auVar50._20_4_ = uVar47;
      auVar50._24_4_ = uVar47;
      auVar50._28_4_ = uVar47;
      local_5ba0 = vsubps_avx(auVar50,*(undefined1 (*) [32])(ray + 0x20));
      uVar47 = *(undefined4 *)(lVar45 + -0x70 + uVar40 * 4);
      auVar51._4_4_ = uVar47;
      auVar51._0_4_ = uVar47;
      auVar51._8_4_ = uVar47;
      auVar51._12_4_ = uVar47;
      auVar51._16_4_ = uVar47;
      auVar51._20_4_ = uVar47;
      auVar51._24_4_ = uVar47;
      auVar51._28_4_ = uVar47;
      local_5bc0 = vsubps_avx(auVar51,*(undefined1 (*) [32])(ray + 0x40));
      fVar2 = *(float *)(lVar45 + -0x60 + uVar40 * 4);
      local_5b40._4_4_ = fVar2;
      local_5b40._0_4_ = fVar2;
      local_5b40._8_4_ = fVar2;
      local_5b40._12_4_ = fVar2;
      local_5b40._16_4_ = fVar2;
      local_5b40._20_4_ = fVar2;
      local_5b40._24_4_ = fVar2;
      local_5b40._28_4_ = fVar2;
      fVar3 = *(float *)(lVar45 + -0x50 + uVar40 * 4);
      local_5b60._4_4_ = fVar3;
      local_5b60._0_4_ = fVar3;
      local_5b60._8_4_ = fVar3;
      local_5b60._12_4_ = fVar3;
      local_5b60._16_4_ = fVar3;
      local_5b60._20_4_ = fVar3;
      local_5b60._24_4_ = fVar3;
      local_5b60._28_4_ = fVar3;
      fVar4 = *(float *)(lVar45 + -0x40 + uVar40 * 4);
      auVar63._4_4_ = fVar4;
      auVar63._0_4_ = fVar4;
      auVar63._8_4_ = fVar4;
      auVar63._12_4_ = fVar4;
      auVar63._16_4_ = fVar4;
      auVar63._20_4_ = fVar4;
      auVar63._24_4_ = fVar4;
      auVar63._28_4_ = fVar4;
      fVar5 = *(float *)(lVar45 + -0x30 + uVar40 * 4);
      auVar69._4_4_ = fVar5;
      auVar69._0_4_ = fVar5;
      auVar69._8_4_ = fVar5;
      auVar69._12_4_ = fVar5;
      auVar69._16_4_ = fVar5;
      auVar69._20_4_ = fVar5;
      auVar69._24_4_ = fVar5;
      auVar69._28_4_ = fVar5;
      fVar6 = *(float *)(lVar45 + -0x20 + uVar40 * 4);
      auVar81._4_4_ = fVar6;
      auVar81._0_4_ = fVar6;
      auVar81._8_4_ = fVar6;
      auVar81._12_4_ = fVar6;
      auVar81._16_4_ = fVar6;
      auVar81._20_4_ = fVar6;
      auVar81._24_4_ = fVar6;
      auVar81._28_4_ = fVar6;
      fVar7 = *(float *)(lVar45 + -0x10 + uVar40 * 4);
      auVar93._4_4_ = fVar7;
      auVar93._0_4_ = fVar7;
      auVar93._8_4_ = fVar7;
      auVar93._12_4_ = fVar7;
      auVar93._16_4_ = fVar7;
      auVar93._20_4_ = fVar7;
      auVar93._24_4_ = fVar7;
      auVar93._28_4_ = fVar7;
      fVar9 = fVar7 * fVar3;
      auVar75._4_4_ = fVar9;
      auVar75._0_4_ = fVar9;
      auVar75._8_4_ = fVar9;
      auVar75._12_4_ = fVar9;
      auVar75._16_4_ = fVar9;
      auVar75._20_4_ = fVar9;
      auVar75._24_4_ = fVar9;
      auVar75._28_4_ = fVar9;
      auVar14 = vfmsub231ps_fma(auVar75,auVar81,auVar63);
      fVar5 = fVar4 * fVar5;
      auVar78._4_4_ = fVar5;
      auVar78._0_4_ = fVar5;
      auVar78._8_4_ = fVar5;
      auVar78._12_4_ = fVar5;
      auVar78._16_4_ = fVar5;
      auVar78._20_4_ = fVar5;
      auVar78._24_4_ = fVar5;
      auVar78._28_4_ = fVar5;
      auVar15 = vfmsub231ps_fma(auVar78,auVar93,local_5b40);
      fVar6 = fVar6 * fVar2;
      auVar91._4_4_ = fVar6;
      auVar91._0_4_ = fVar6;
      auVar91._8_4_ = fVar6;
      auVar91._12_4_ = fVar6;
      auVar91._16_4_ = fVar6;
      auVar91._20_4_ = fVar6;
      auVar91._24_4_ = fVar6;
      auVar91._28_4_ = fVar6;
      auVar16 = vfmsub231ps_fma(auVar91,auVar69,local_5b60);
      auVar17._4_4_ = auVar34._4_4_ * local_5bc0._4_4_;
      auVar17._0_4_ = auVar34._0_4_ * local_5bc0._0_4_;
      auVar17._8_4_ = auVar34._8_4_ * local_5bc0._8_4_;
      auVar17._12_4_ = auVar34._12_4_ * local_5bc0._12_4_;
      auVar17._16_4_ = auVar34._16_4_ * local_5bc0._16_4_;
      auVar17._20_4_ = auVar34._20_4_ * local_5bc0._20_4_;
      auVar17._24_4_ = (float)uStack_5aa8 * local_5bc0._24_4_;
      auVar17._28_4_ = fVar2;
      auVar11 = vfmsub231ps_fma(auVar17,local_5ba0,*(undefined1 (*) [32])pRVar8);
      auVar18._4_4_ = auVar35._4_4_ * local_5b80._4_4_;
      auVar18._0_4_ = auVar35._0_4_ * local_5b80._0_4_;
      auVar18._8_4_ = auVar35._8_4_ * local_5b80._8_4_;
      auVar18._12_4_ = auVar35._12_4_ * local_5b80._12_4_;
      auVar18._16_4_ = auVar35._16_4_ * local_5b80._16_4_;
      auVar18._20_4_ = auVar35._20_4_ * local_5b80._20_4_;
      auVar18._24_4_ = (float)uStack_5ac8 * local_5b80._24_4_;
      auVar18._28_4_ = fVar3;
      auVar12 = vfmsub231ps_fma(auVar18,local_5bc0,*(undefined1 (*) [32])pRVar1);
      auVar19._4_4_ = auVar36._4_4_ * local_5ba0._4_4_;
      auVar19._0_4_ = auVar36._0_4_ * local_5ba0._0_4_;
      auVar19._8_4_ = auVar36._8_4_ * local_5ba0._8_4_;
      auVar19._12_4_ = auVar36._12_4_ * local_5ba0._12_4_;
      auVar19._16_4_ = auVar36._16_4_ * local_5ba0._16_4_;
      auVar19._20_4_ = auVar36._20_4_ * local_5ba0._20_4_;
      auVar19._24_4_ = (float)uStack_5ae8 * local_5ba0._24_4_;
      auVar19._28_4_ = local_5ba0._28_4_;
      auVar13 = vfmsub231ps_fma(auVar19,local_5b80,*(undefined1 (*) [32])pRVar44);
      auVar20._4_4_ = auVar16._4_4_ * auVar35._4_4_;
      auVar20._0_4_ = auVar16._0_4_ * auVar35._0_4_;
      auVar20._8_4_ = auVar16._8_4_ * auVar35._8_4_;
      auVar20._12_4_ = auVar16._12_4_ * auVar35._12_4_;
      auVar20._16_4_ = auVar35._16_4_ * 0.0;
      auVar20._20_4_ = auVar35._20_4_ * 0.0;
      auVar20._24_4_ = (float)uStack_5ac8 * 0.0;
      auVar20._28_4_ = (int)((ulong)uStack_5ac8 >> 0x20);
      auVar54 = vfmadd231ps_fma(auVar20,ZEXT1632(auVar15),*(undefined1 (*) [32])pRVar44);
      auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),ZEXT1632(auVar14),*(undefined1 (*) [32])pRVar1);
      auVar21._4_4_ = fVar7 * auVar13._4_4_;
      auVar21._0_4_ = fVar7 * auVar13._0_4_;
      auVar21._8_4_ = fVar7 * auVar13._8_4_;
      auVar21._12_4_ = fVar7 * auVar13._12_4_;
      auVar21._16_4_ = fVar7 * 0.0;
      auVar21._20_4_ = fVar7 * 0.0;
      auVar21._24_4_ = fVar7 * 0.0;
      auVar21._28_4_ = fVar7;
      auVar10 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar12),auVar81);
      auVar82._8_4_ = 0x80000000;
      auVar82._0_8_ = 0x8000000080000000;
      auVar82._12_4_ = 0x80000000;
      auVar82._16_4_ = 0x80000000;
      auVar82._20_4_ = 0x80000000;
      auVar82._24_4_ = 0x80000000;
      auVar82._28_4_ = 0x80000000;
      auVar53 = vandps_avx(auVar82,ZEXT1632(auVar54));
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar11),auVar69);
      uVar79 = auVar53._0_4_;
      auVar94._0_4_ = uVar79 ^ auVar10._0_4_;
      uVar84 = auVar53._4_4_;
      auVar94._4_4_ = uVar84 ^ auVar10._4_4_;
      uVar85 = auVar53._8_4_;
      auVar94._8_4_ = uVar85 ^ auVar10._8_4_;
      uVar86 = auVar53._12_4_;
      auVar94._12_4_ = uVar86 ^ auVar10._12_4_;
      uVar47 = auVar53._16_4_;
      auVar94._16_4_ = uVar47;
      uVar87 = auVar53._20_4_;
      auVar94._20_4_ = uVar87;
      uVar88 = auVar53._24_4_;
      auVar94._24_4_ = uVar88;
      uVar89 = auVar53._28_4_;
      auVar94._28_4_ = uVar89;
      auVar53 = vcmpps_avx(auVar94,ZEXT832(0) << 0x20,5);
      auVar65 = auVar55 & auVar53;
      auVar70._8_8_ = uStack_5cf8;
      auVar70._0_8_ = local_5d00;
      auVar70._16_8_ = uStack_5cf0;
      auVar70._24_8_ = uStack_5ce8;
      if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar65 >> 0x7f,0) != '\0') ||
            (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar65 >> 0xbf,0) != '\0') ||
          (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar65[0x1f] < '\0') {
        auVar53 = vandps_avx(auVar53,auVar55);
        auVar22._4_4_ = auVar13._4_4_ * fVar4;
        auVar22._0_4_ = auVar13._0_4_ * fVar4;
        auVar22._8_4_ = auVar13._8_4_ * fVar4;
        auVar22._12_4_ = auVar13._12_4_ * fVar4;
        auVar22._16_4_ = fVar4 * 0.0;
        auVar22._20_4_ = fVar4 * 0.0;
        auVar22._24_4_ = fVar4 * 0.0;
        auVar22._28_4_ = fVar4;
        auVar10 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar22,local_5b60);
        auVar10 = vfmadd132ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar10),local_5b40);
        auVar61._0_4_ = uVar79 ^ auVar10._0_4_;
        auVar61._4_4_ = uVar84 ^ auVar10._4_4_;
        auVar61._8_4_ = uVar85 ^ auVar10._8_4_;
        auVar61._12_4_ = uVar86 ^ auVar10._12_4_;
        auVar61._16_4_ = uVar47;
        auVar61._20_4_ = uVar87;
        auVar61._24_4_ = uVar88;
        auVar61._28_4_ = uVar89;
        auVar65 = vcmpps_avx(auVar61,ZEXT832(0) << 0x20,5);
        auVar66 = auVar53 & auVar65;
        if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar66 >> 0x7f,0) != '\0') ||
              (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar66 >> 0xbf,0) != '\0') ||
            (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar66[0x1f] < '\0') {
          auVar66 = vandps_avx(ZEXT1632(auVar54),local_5c00);
          auVar53 = vandps_avx(auVar53,auVar65);
          auVar65 = vsubps_avx(auVar66,auVar94);
          auVar65 = vcmpps_avx(auVar65,auVar61,5);
          auVar67 = auVar53 & auVar65;
          if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar67 >> 0x7f,0) != '\0') ||
                (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar67 >> 0xbf,0) != '\0') ||
              (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar67[0x1f] < '\0') {
            auVar65 = vandps_avx(auVar65,auVar53);
            auVar23._4_4_ = auVar16._4_4_ * local_5bc0._4_4_;
            auVar23._0_4_ = auVar16._0_4_ * local_5bc0._0_4_;
            auVar23._8_4_ = auVar16._8_4_ * local_5bc0._8_4_;
            auVar23._12_4_ = auVar16._12_4_ * local_5bc0._12_4_;
            auVar23._16_4_ = local_5bc0._16_4_ * 0.0;
            auVar23._20_4_ = local_5bc0._20_4_ * 0.0;
            auVar23._24_4_ = local_5bc0._24_4_ * 0.0;
            auVar23._28_4_ = auVar53._28_4_;
            auVar10 = vfmadd213ps_fma(local_5ba0,ZEXT1632(auVar15),auVar23);
            auVar10 = vfmadd213ps_fma(local_5b80,ZEXT1632(auVar14),ZEXT1632(auVar10));
            auVar64._0_4_ = uVar79 ^ auVar10._0_4_;
            auVar64._4_4_ = uVar84 ^ auVar10._4_4_;
            auVar64._8_4_ = uVar85 ^ auVar10._8_4_;
            auVar64._12_4_ = uVar86 ^ auVar10._12_4_;
            auVar64._16_4_ = uVar47;
            auVar64._20_4_ = uVar87;
            auVar64._24_4_ = uVar88;
            auVar64._28_4_ = uVar89;
            local_5c40._0_4_ = (float)uVar25;
            local_5c40._4_4_ = (float)((ulong)uVar25 >> 0x20);
            uStack_5c38._0_4_ = (float)uVar26;
            uStack_5c38._4_4_ = (float)((ulong)uVar26 >> 0x20);
            uStack_5c30._0_4_ = (float)uVar27;
            uStack_5c30._4_4_ = (float)((ulong)uVar27 >> 0x20);
            auVar71._0_4_ = auVar66._0_4_ * (float)local_5c40;
            auVar71._4_4_ = auVar66._4_4_ * local_5c40._4_4_;
            auVar71._8_4_ = auVar66._8_4_ * (float)uStack_5c38;
            auVar71._12_4_ = auVar66._12_4_ * uStack_5c38._4_4_;
            auVar71._16_4_ = auVar66._16_4_ * (float)uStack_5c30;
            auVar71._20_4_ = auVar66._20_4_ * uStack_5c30._4_4_;
            auVar71._24_4_ = auVar66._24_4_ * (float)uStack_5c28;
            auVar71._28_4_ = 0;
            auVar53 = vcmpps_avx(auVar71,auVar64,1);
            local_5c60._0_4_ = (float)uVar28;
            local_5c60._4_4_ = (float)((ulong)uVar28 >> 0x20);
            uStack_5c58._0_4_ = (float)uVar29;
            uStack_5c58._4_4_ = (float)((ulong)uVar29 >> 0x20);
            uStack_5c50._0_4_ = (float)uVar30;
            uStack_5c50._4_4_ = (float)((ulong)uVar30 >> 0x20);
            auVar24._4_4_ = auVar66._4_4_ * local_5c60._4_4_;
            auVar24._0_4_ = auVar66._0_4_ * (float)local_5c60;
            auVar24._8_4_ = auVar66._8_4_ * (float)uStack_5c58;
            auVar24._12_4_ = auVar66._12_4_ * uStack_5c58._4_4_;
            auVar24._16_4_ = auVar66._16_4_ * (float)uStack_5c50;
            auVar24._20_4_ = auVar66._20_4_ * uStack_5c50._4_4_;
            auVar24._24_4_ = auVar66._24_4_ * (float)uStack_5c48;
            auVar24._28_4_ = auVar66._28_4_;
            auVar66 = vcmpps_avx(auVar64,auVar24,2);
            auVar53 = vandps_avx(auVar66,auVar53);
            auVar66 = auVar65 & auVar53;
            if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar66 >> 0x7f,0) != '\0') ||
                  (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar66 >> 0xbf,0) != '\0') ||
                (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar66[0x1f] < '\0') {
              auVar53 = vandps_avx(auVar53,auVar65);
              auVar65 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar54),4);
              auVar66 = auVar53 & auVar65;
              if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar66 >> 0x7f,0) == '\0') &&
                    (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar66 >> 0xbf,0) == '\0') &&
                  (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar66[0x1f]) {
              }
              else {
                auVar70 = vandps_avx(auVar65,auVar53);
              }
            }
          }
        }
      }
      uVar79 = ((context->scene->geometries).items[uVar42].ptr)->mask;
      auVar52._4_4_ = uVar79;
      auVar52._0_4_ = uVar79;
      auVar52._8_4_ = uVar79;
      auVar52._12_4_ = uVar79;
      auVar52._16_4_ = uVar79;
      auVar52._20_4_ = uVar79;
      auVar52._24_4_ = uVar79;
      auVar52._28_4_ = uVar79;
      auVar53 = vpand_avx2(auVar52,*(undefined1 (*) [32])(ray + 0x120));
      auVar65 = vpcmpeqd_avx2(ZEXT832(0) << 0x20,auVar53);
      auVar53 = auVar70 & ~auVar65;
      auVar66 = ZEXT1632(auVar16);
      if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar53 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar53 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar53 >> 0x7f,0) == '\0') &&
            (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar53 >> 0xbf,0) == '\0') &&
          (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar53[0x1f])
      {
        auVar53 = vpcmpeqd_avx2(auVar66,auVar66);
      }
      else {
        auVar62 = vandnps_avx(auVar65,auVar70);
        auVar62 = vandnps_avx(auVar62,auVar55);
        auVar53 = vpcmpeqd_avx2(auVar66,auVar66);
      }
      auVar92 = ZEXT3264(auVar53);
      auVar83 = ZEXT3264(CONCAT428(0x7f800000,
                                   CONCAT424(0x7f800000,
                                             CONCAT420(0x7f800000,
                                                       CONCAT416(0x7f800000,
                                                                 CONCAT412(0x7f800000,
                                                                           CONCAT48(0x7f800000,
                                                                                                                                                                        
                                                  0x7f8000007f800000)))))));
      local_5ce0 = auVar55;
      if (((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                (auVar62 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar62 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              SUB321(auVar62 >> 0x7f,0) == '\0') &&
             (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            SUB321(auVar62 >> 0xbf,0) == '\0') &&
           (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar62[0x1f]
          ) || (bVar48 = 2 < uVar40, uVar40 = uVar40 + 1, bVar48)) break;
    }
    auVar55 = vandps_avx(auVar62,auVar60);
    auVar60 = auVar60 & auVar62;
    if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar60 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar60 >> 0x7f,0) == '\0') &&
          (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar60 >> 0xbf,0) == '\0') &&
        (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar60[0x1f])
    break;
  }
  auVar53._0_4_ = auVar92._0_4_ ^ auVar55._0_4_;
  auVar53._4_4_ = auVar92._4_4_ ^ auVar55._4_4_;
  auVar53._8_4_ = auVar92._8_4_ ^ auVar55._8_4_;
  auVar53._12_4_ = auVar92._12_4_ ^ auVar55._12_4_;
  auVar53._16_4_ = auVar92._16_4_ ^ auVar55._16_4_;
  auVar53._20_4_ = auVar92._20_4_ ^ auVar55._20_4_;
  auVar53._24_4_ = auVar92._24_4_ ^ auVar55._24_4_;
  auVar53._28_4_ = auVar92._28_4_ ^ auVar55._28_4_;
  unaff_R15 = local_5d28;
  local_5c60 = uVar28;
  uStack_5c58 = uVar29;
  uStack_5c50 = uVar30;
  local_5c40 = uVar25;
  uStack_5c38 = uVar26;
  uStack_5c30 = uVar27;
LAB_00687006:
  local_5cc0 = vorps_avx(local_5cc0,auVar53);
  auVar62 = auVar92._0_32_ & ~local_5cc0;
  if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar62 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar62 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar62 >> 0x7f,0) == '\0') &&
        (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar62 >> 0xbf,0) == '\0') &&
      (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar62[0x1f]) {
LAB_0068703f:
    iVar37 = 3;
  }
  else {
    auVar57._8_4_ = 0xff800000;
    auVar57._0_8_ = 0xff800000ff800000;
    auVar57._12_4_ = 0xff800000;
    auVar57._16_4_ = 0xff800000;
    auVar57._20_4_ = 0xff800000;
    auVar57._24_4_ = 0xff800000;
    auVar57._28_4_ = 0xff800000;
    local_5840 = vblendvps_avx(local_5840,auVar57,local_5cc0);
    iVar37 = 0;
  }
LAB_00687042:
  if (iVar37 == 3) {
    auVar62 = vandps_avx(local_5be0,local_5cc0);
    auVar58._8_4_ = 0xff800000;
    auVar58._0_8_ = 0xff800000ff800000;
    auVar58._12_4_ = 0xff800000;
    auVar58._16_4_ = 0xff800000;
    auVar58._20_4_ = 0xff800000;
    auVar58._24_4_ = 0xff800000;
    auVar58._28_4_ = 0xff800000;
    auVar62 = vmaskmovps_avx(auVar62,auVar58);
    *(undefined1 (*) [32])local_5d28 = auVar62;
    return;
  }
  goto LAB_00686a15;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }